

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O3

void __thiscall DListMenu::Init(DListMenu *this,DMenu *parent,FListMenuDescriptor *desc)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  
  (this->super_DMenu).mParentMenu.field_0.p = parent;
  if (((parent != (DMenu *)0x0) && (((parent->super_DObject).ObjectFlags & 3) != 0)) &&
     (((this->super_DMenu).super_DObject.ObjectFlags & 4) != 0)) {
    GC::Barrier((DObject *)this,&parent->super_DObject);
  }
  this->mDesc = desc;
  if ((desc->mCenter == true) &&
     ((desc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count != 0)) {
    iVar6 = 0xa0;
    uVar5 = 0;
    do {
      iVar3 = (*(desc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar5]->
                _vptr_FListMenuItem[0x10])();
      if (0 < iVar3) {
        iVar1 = this->mDesc->mSelectOfsX;
        iVar4 = (*(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar5]
                  ->_vptr_FListMenuItem[5])();
        if ((char)iVar4 != '\0') {
          iVar3 = 0xa0 - ((iVar3 - iVar1) / 2 + iVar1);
          if (iVar3 < iVar6) {
            iVar6 = iVar3;
          }
        }
      }
      uVar5 = uVar5 + 1;
      desc = this->mDesc;
      uVar2 = (desc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count;
    } while (uVar5 < uVar2);
    if (uVar2 != 0) {
      uVar5 = 0;
      do {
        iVar3 = (*(desc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar5]->
                  _vptr_FListMenuItem[0x10])();
        desc = this->mDesc;
        if (0 < iVar3) {
          (desc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar5]->mXpos = iVar6;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (desc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count);
    }
  }
  return;
}

Assistant:

void DListMenu::Init(DMenu *parent, FListMenuDescriptor *desc)
{
	mParentMenu = parent;
	GC::WriteBarrier(this, parent);
	mDesc = desc;
	if (desc->mCenter)
	{
		int center = 160;
		for(unsigned i=0;i<mDesc->mItems.Size(); i++)
		{
			int xpos = mDesc->mItems[i]->GetX();
			int width = mDesc->mItems[i]->GetWidth();
			int curx = mDesc->mSelectOfsX;

			if (width > 0 && mDesc->mItems[i]->Selectable())
			{
				int left = 160 - (width - curx) / 2 - curx;
				if (left < center) center = left;
			}
		}
		for(unsigned i=0;i<mDesc->mItems.Size(); i++)
		{
			int width = mDesc->mItems[i]->GetWidth();

			if (width > 0)
			{
				mDesc->mItems[i]->SetX(center);
			}
		}
	}
}